

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side3_6d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  
  dVar43 = *p0;
  dVar53 = p0[1];
  dVar4 = *p1 - dVar43;
  dVar39 = p1[1] - dVar53;
  dVar50 = p0[2];
  dVar9 = p1[2] - dVar50;
  dVar34 = p0[3];
  dVar35 = p1[3] - dVar34;
  dVar7 = p0[4];
  dVar23 = p1[4] - dVar7;
  dVar56 = p0[5];
  dVar51 = p1[5] - dVar56;
  dVar22 = ABS(dVar9);
  if (ABS(dVar9) <= ABS(dVar4)) {
    dVar22 = ABS(dVar4);
  }
  dVar5 = ABS(dVar39);
  if (ABS(dVar39) <= dVar22) {
    dVar5 = dVar22;
  }
  dVar22 = ABS(dVar35);
  if (ABS(dVar35) <= dVar5) {
    dVar22 = dVar5;
  }
  dVar5 = ABS(dVar23);
  if (ABS(dVar23) <= dVar22) {
    dVar5 = dVar22;
  }
  dVar22 = ABS(dVar51);
  if (ABS(dVar51) <= dVar5) {
    dVar22 = dVar5;
  }
  dVar42 = *p2 - dVar43;
  dVar10 = p2[1] - dVar53;
  dVar5 = ABS(dVar10);
  if (ABS(dVar10) <= ABS(dVar42)) {
    dVar5 = ABS(dVar42);
  }
  dVar24 = p2[2] - dVar50;
  dVar31 = ABS(dVar24);
  if (ABS(dVar24) <= dVar5) {
    dVar31 = dVar5;
  }
  dVar11 = p2[3] - dVar34;
  dVar5 = ABS(dVar11);
  if (ABS(dVar11) <= dVar31) {
    dVar5 = dVar31;
  }
  dVar25 = p2[4] - dVar7;
  dVar31 = ABS(dVar25);
  if (ABS(dVar25) <= dVar5) {
    dVar31 = dVar5;
  }
  dVar6 = p2[5] - dVar56;
  dVar5 = ABS(dVar6);
  if (ABS(dVar6) <= dVar31) {
    dVar5 = dVar31;
  }
  dVar12 = *q0 - dVar43;
  dVar26 = q0[1] - dVar53;
  dVar31 = ABS(dVar26);
  if (ABS(dVar26) <= ABS(dVar12)) {
    dVar31 = ABS(dVar12);
  }
  dVar13 = q0[2] - dVar50;
  dVar20 = ABS(dVar13);
  if (ABS(dVar13) <= dVar31) {
    dVar20 = dVar31;
  }
  dVar27 = q0[3] - dVar34;
  dVar31 = ABS(dVar27);
  if (ABS(dVar27) <= dVar20) {
    dVar31 = dVar20;
  }
  dVar14 = q0[4] - dVar7;
  dVar20 = ABS(dVar14);
  if (ABS(dVar14) <= dVar31) {
    dVar20 = dVar31;
  }
  dVar28 = q0[5] - dVar56;
  dVar31 = ABS(dVar28);
  if (ABS(dVar28) <= dVar20) {
    dVar31 = dVar20;
  }
  dVar15 = *q1 - dVar43;
  dVar20 = ABS(dVar15);
  if (ABS(dVar15) <= dVar31) {
    dVar20 = dVar31;
  }
  dVar29 = q1[1] - dVar53;
  dVar31 = ABS(dVar29);
  if (ABS(dVar29) <= dVar20) {
    dVar31 = dVar20;
  }
  dVar16 = q1[2] - dVar50;
  dVar20 = ABS(dVar16);
  if (ABS(dVar16) <= dVar31) {
    dVar20 = dVar31;
  }
  dVar30 = q1[3] - dVar34;
  dVar31 = ABS(dVar30);
  if (ABS(dVar30) <= dVar20) {
    dVar31 = dVar20;
  }
  dVar17 = q1[4] - dVar7;
  dVar20 = ABS(dVar17);
  if (ABS(dVar17) <= dVar31) {
    dVar20 = dVar31;
  }
  dVar36 = q1[5] - dVar56;
  dVar31 = ABS(dVar36);
  if (ABS(dVar36) <= dVar20) {
    dVar31 = dVar20;
  }
  dVar18 = *q2 - dVar43;
  dVar20 = ABS(dVar18);
  if (ABS(dVar18) <= dVar31) {
    dVar20 = dVar31;
  }
  dVar48 = q2[1] - dVar53;
  dVar31 = ABS(dVar48);
  if (ABS(dVar48) <= dVar20) {
    dVar31 = dVar20;
  }
  dVar19 = q2[2] - dVar50;
  dVar20 = ABS(dVar19);
  if (ABS(dVar19) <= dVar31) {
    dVar20 = dVar31;
  }
  dVar45 = q2[3] - dVar34;
  dVar31 = ABS(dVar45);
  if (ABS(dVar45) <= dVar20) {
    dVar31 = dVar20;
  }
  dVar32 = q2[4] - dVar7;
  dVar20 = ABS(dVar32);
  if (ABS(dVar32) <= dVar31) {
    dVar20 = dVar31;
  }
  dVar57 = q2[5] - dVar56;
  dVar31 = ABS(dVar57);
  if (ABS(dVar57) <= dVar20) {
    dVar31 = dVar20;
  }
  dVar20 = dVar5;
  dVar33 = dVar22;
  if ((dVar22 <= dVar5) && (dVar20 = dVar22, dVar22 < dVar5)) {
    dVar33 = dVar5;
  }
  dVar37 = dVar31;
  if ((dVar20 <= dVar31) && (dVar37 = dVar20, dVar33 < dVar31)) {
    dVar33 = dVar31;
  }
  iVar3 = 0;
  iVar2 = 0;
  if ((1.4995850219305951e-74 <= dVar37) && (iVar2 = iVar3, dVar33 <= 1.2980742146337065e+33)) {
    dVar40 = dVar51 * dVar28 +
             dVar23 * dVar14 + dVar35 * dVar27 + dVar9 * dVar13 + dVar4 * dVar12 + dVar39 * dVar26;
    dVar49 = dVar51 * dVar36 +
             dVar23 * dVar17 + dVar35 * dVar30 + dVar9 * dVar16 + dVar4 * dVar15 + dVar39 * dVar29;
    dVar55 = dVar51 * dVar57 +
             dVar23 * dVar32 + dVar35 * dVar45 + dVar9 * dVar19 + dVar4 * dVar18 + dVar39 * dVar48;
    dVar38 = dVar6 * dVar28 +
             dVar25 * dVar14 + dVar11 * dVar27 + dVar24 * dVar13 + dVar42 * dVar12 + dVar10 * dVar26
    ;
    dVar37 = dVar6 * dVar36 +
             dVar25 * dVar17 + dVar11 * dVar30 + dVar24 * dVar16 + dVar42 * dVar15 + dVar10 * dVar29
    ;
    dVar46 = dVar6 * dVar57 +
             dVar25 * dVar32 + dVar11 * dVar45 + dVar24 * dVar19 + dVar42 * dVar18 + dVar10 * dVar48
    ;
    dVar40 = dVar40 + dVar40;
    dVar49 = dVar49 + dVar49;
    dVar55 = dVar55 + dVar55;
    dVar38 = dVar38 + dVar38;
    dVar37 = dVar37 + dVar37;
    dVar46 = dVar46 + dVar46;
    dVar52 = dVar49 * dVar46 - dVar37 * dVar55;
    dVar47 = dVar55 * dVar38 - dVar46 * dVar40;
    dVar33 = dVar40 * dVar37 - dVar38 * dVar49;
    dVar41 = dVar52 + dVar47 + dVar33;
    dVar20 = dVar22 * dVar31 * dVar5 * dVar31 * 4.400074760265839e-13;
    iVar3 = 1;
    if ((dVar20 < dVar41) || (iVar3 = -1, dVar41 < -dVar20)) {
      dVar43 = *p3 - dVar43;
      dVar53 = p3[1] - dVar53;
      dVar50 = p3[2] - dVar50;
      dVar34 = p3[3] - dVar34;
      dVar7 = p3[4] - dVar7;
      dVar56 = p3[5] - dVar56;
      dVar20 = dVar5;
      if (dVar5 <= dVar22) {
        dVar20 = dVar22;
      }
      dVar44 = dVar31;
      if (dVar31 <= dVar20) {
        dVar44 = dVar20;
      }
      dVar20 = ABS(dVar53);
      if (ABS(dVar53) <= dVar22) {
        dVar20 = dVar22;
      }
      dVar8 = ABS(dVar50);
      if (ABS(dVar50) <= dVar20) {
        dVar8 = dVar20;
      }
      dVar20 = ABS(dVar43);
      if (ABS(dVar43) <= dVar8) {
        dVar20 = dVar8;
      }
      dVar8 = ABS(dVar34);
      if (ABS(dVar34) <= dVar20) {
        dVar8 = dVar20;
      }
      dVar20 = ABS(dVar7);
      if (ABS(dVar7) <= dVar8) {
        dVar20 = dVar8;
      }
      dVar8 = ABS(dVar56);
      if (ABS(dVar56) <= dVar20) {
        dVar8 = dVar20;
      }
      dVar20 = dVar8;
      if (dVar8 <= dVar44) {
        dVar20 = dVar44;
      }
      dVar44 = dVar31;
      if (dVar31 <= dVar22) {
        dVar44 = dVar22;
      }
      dVar22 = dVar8;
      if (dVar8 <= dVar44) {
        dVar22 = dVar44;
      }
      dVar58 = dVar44;
      if (dVar44 <= dVar22) {
        dVar58 = dVar22;
      }
      dVar22 = dVar58;
      if (dVar58 <= dVar20) {
        dVar22 = dVar20;
      }
      dVar20 = dVar44;
      if (dVar44 <= dVar22) {
        dVar20 = dVar22;
      }
      dVar22 = dVar31;
      if (dVar5 <= dVar31) {
        dVar22 = dVar5;
      }
      dVar21 = dVar5;
      dVar54 = dVar20;
      if ((dVar22 <= dVar20) && (dVar54 = dVar22, dVar5 < dVar20)) {
        dVar21 = dVar20;
      }
      dVar22 = dVar8;
      if (dVar54 <= dVar8) {
        dVar22 = dVar54;
      }
      dVar54 = dVar58;
      if (dVar22 <= dVar58) {
        dVar54 = dVar22;
      }
      dVar22 = dVar44;
      if (dVar54 <= dVar44) {
        dVar22 = dVar54;
      }
      if ((3.31864264949884e-50 <= dVar22) && (dVar21 <= 1.2980742146337065e+33)) {
        dVar35 = dVar51 * dVar51 +
                 dVar23 * dVar23 + dVar35 * dVar35 + dVar9 * dVar9 + dVar4 * dVar4 + dVar39 * dVar39
        ;
        dVar9 = dVar6 * dVar6 +
                dVar25 * dVar25 +
                dVar11 * dVar11 + dVar24 * dVar24 + dVar42 * dVar42 + dVar10 * dVar10;
        dVar4 = dVar28 * dVar56 +
                dVar14 * dVar7 +
                dVar27 * dVar34 + dVar13 * dVar50 + dVar12 * dVar43 + dVar26 * dVar53;
        dVar39 = dVar36 * dVar56 +
                 dVar17 * dVar7 +
                 dVar30 * dVar34 + dVar16 * dVar50 + dVar15 * dVar43 + dVar29 * dVar53;
        dVar22 = dVar57 * dVar56 +
                 dVar32 * dVar7 +
                 dVar45 * dVar34 + dVar19 * dVar50 + dVar18 * dVar43 + dVar48 * dVar53;
        dVar23 = dVar5 * dVar8 * dVar31 * dVar44 * dVar58 * dVar20 * 1.665641335871132e-11;
        dVar43 = dVar41 * (dVar56 * dVar56 +
                          dVar7 * dVar7 +
                          dVar34 * dVar34 + dVar50 * dVar50 + dVar43 * dVar43 + dVar53 * dVar53) -
                 ((dVar33 + (dVar38 - dVar37) * dVar35 + (dVar49 - dVar40) * dVar9) *
                  (dVar22 + dVar22) +
                 (dVar47 + (dVar46 - dVar38) * dVar35 + (dVar40 - dVar55) * dVar9) *
                 (dVar39 + dVar39) +
                 (dVar52 + (dVar37 - dVar46) * dVar35 + (dVar55 - dVar49) * dVar9) * (dVar4 + dVar4)
                 );
        iVar1 = 1;
        if ((dVar23 < dVar43) || (iVar1 = -1, dVar43 < -dVar23)) {
          iVar2 = iVar1 * iVar3;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

inline int side3_6d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double l1;
    l1 = (1 * ((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double l2;
    l2 = (1 * ((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double l3;
    l3 = (1 * ((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double a10;
    a10 = (2 * ((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double a11;
    a11 = (2 * ((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double a12;
    a12 = (2 * ((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)));
    double a20;
    a20 = (2 * ((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)));
    double a21;
    a21 = (2 * ((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)));
    double a22;
    a22 = (2 * ((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)));
    double a30;
    a30 = (2 * ((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)));
    double a31;
    a31 = (2 * ((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)));
    double a32;
    a32 = (2 * ((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_0_p0_0);
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    double max2 = fabs(p2_0_p0_0);
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_3_p0_3)) )
    {
        max2 = fabs(p2_3_p0_3);
    } 
    if( (max2 < fabs(p2_4_p0_4)) )
    {
        max2 = fabs(p2_4_p0_4);
    } 
    if( (max2 < fabs(p2_5_p0_5)) )
    {
        max2 = fabs(p2_5_p0_5);
    } 
    double max3 = fabs(q0_0_p0_0);
    if( (max3 < fabs(q0_1_p0_1)) )
    {
        max3 = fabs(q0_1_p0_1);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q0_4_p0_4)) )
    {
        max3 = fabs(q0_4_p0_4);
    } 
    if( (max3 < fabs(q0_5_p0_5)) )
    {
        max3 = fabs(q0_5_p0_5);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q1_4_p0_4)) )
    {
        max3 = fabs(q1_4_p0_4);
    } 
    if( (max3 < fabs(q1_5_p0_5)) )
    {
        max3 = fabs(q1_5_p0_5);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    if( (max3 < fabs(q2_4_p0_4)) )
    {
        max3 = fabs(q2_4_p0_4);
    } 
    if( (max3 < fabs(q2_5_p0_5)) )
    {
        max3 = fabs(q2_5_p0_5);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.49958502193059513986e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.40007476026583916019e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max1;
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max5 = max1;
    if( (max5 < fabs(p3_1_p0_1)) )
    {
        max5 = fabs(p3_1_p0_1);
    } 
    if( (max5 < fabs(p3_2_p0_2)) )
    {
        max5 = fabs(p3_2_p0_2);
    } 
    if( (max5 < fabs(p3_0_p0_0)) )
    {
        max5 = fabs(p3_0_p0_0);
    } 
    if( (max5 < fabs(p3_3_p0_3)) )
    {
        max5 = fabs(p3_3_p0_3);
    } 
    if( (max5 < fabs(p3_4_p0_4)) )
    {
        max5 = fabs(p3_4_p0_4);
    } 
    if( (max5 < fabs(p3_5_p0_5)) )
    {
        max5 = fabs(p3_5_p0_5);
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    double max6 = max1;
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max6 < max5) )
    {
        max6 = max5;
    } 
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    if( (max6 < max7) )
    {
        max6 = max7;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 3.31864264949884013629e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66564133587113197628e-11 * (((((max5 * max3) * max2) * max7) * max6) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}